

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

OutRec * ClipperLib::GetLowermostRec(OutRec *outRec1,OutRec *outRec2)

{
  OutPt *btmPt1;
  OutPt *btmPt2;
  bool bVar1;
  OutPt *outPt2;
  OutPt *outPt1;
  OutRec *outRec2_local;
  OutRec *outRec1_local;
  
  btmPt1 = outRec1->bottomPt;
  btmPt2 = outRec2->bottomPt;
  outRec1_local = outRec1;
  if (((((btmPt1->pt).Y <= (btmPt2->pt).Y) &&
       (outRec1_local = outRec2, (btmPt2->pt).Y <= (btmPt1->pt).Y)) &&
      (outRec1_local = outRec1, (btmPt2->pt).X <= (btmPt1->pt).X)) &&
     (((outRec1_local = outRec2, (btmPt1->pt).X <= (btmPt2->pt).X && (btmPt1->next != btmPt1)) &&
      ((outRec1_local = outRec1, btmPt2->next != btmPt2 &&
       (bVar1 = FirstIsBottomPt(btmPt1,btmPt2), !bVar1)))))) {
    outRec1_local = outRec2;
  }
  return outRec1_local;
}

Assistant:

OutRec* GetLowermostRec(OutRec *outRec1, OutRec *outRec2)
{
  //work out which polygon fragment has the correct hole state ...
  OutPt *outPt1 = outRec1->bottomPt;
  OutPt *outPt2 = outRec2->bottomPt;
  if (outPt1->pt.Y > outPt2->pt.Y) return outRec1;
  else if (outPt1->pt.Y < outPt2->pt.Y) return outRec2;
  else if (outPt1->pt.X < outPt2->pt.X) return outRec1;
  else if (outPt1->pt.X > outPt2->pt.X) return outRec2;
  else if (outPt1->next == outPt1) return outRec2;
  else if (outPt2->next == outPt2) return outRec1;
  else if (FirstIsBottomPt(outPt1, outPt2)) return outRec1;
  else return outRec2;
}